

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void * internal_exr_alloc(size_t bytes)

{
  void *pvVar1;
  
  if (_glob_alloc_func != (exr_memory_allocation_func_t)0x0) {
    pvVar1 = (*_glob_alloc_func)(bytes);
    return pvVar1;
  }
  pvVar1 = malloc(bytes);
  return pvVar1;
}

Assistant:

void*
internal_exr_alloc (size_t bytes)
{
    if (_glob_alloc_func) return (*_glob_alloc_func) (bytes);
#ifdef _WIN32
    return HeapAlloc (GetProcessHeap (), 0, bytes);
#else
    return malloc (bytes);
#endif
}